

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O1

void duckdb_je_inspect_extent_util_stats_verbose_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size,size_t *bin_nfree,
               size_t *bin_nregs,void **slabcur_addr)

{
  rtree_ctx_cache_elm_t *prVar1;
  malloc_mutex_t *mutex;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  rtree_leaf_elm_t *prVar4;
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  ulong uVar8;
  size_t sVar9;
  edata_t *peVar10;
  void *pvVar11;
  uint uVar12;
  void *pvVar13;
  rtree_ctx_t *ctx;
  pthread_mutex_t *__mutex;
  rtree_leaf_elm_t *prVar14;
  ulong uVar15;
  rtree_ctx_cache_elm_t *prVar16;
  rtree_ctx_cache_elm_t *prVar17;
  mutex_prof_data_t *data;
  bool bVar18;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar13 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar8 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar14 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar8);
  pvVar11 = *(void **)((long)&ctx->cache[0].leafkey + uVar8);
  if (pvVar11 == pvVar13) {
    prVar14 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar14[1].le_bits.repr);
  }
  else if ((void *)ctx->l2_cache[0].leafkey == pvVar13) {
    prVar4 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)pvVar11;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar13;
    prVar14[1].le_bits.repr = prVar4;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar4->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar16 = ctx->l2_cache + 1;
    if ((void *)ctx->l2_cache[1].leafkey == pvVar13) {
      uVar15 = 0;
      bVar18 = false;
    }
    else {
      uVar8 = 1;
      prVar17 = prVar16;
      do {
        uVar15 = uVar8;
        bVar18 = 6 < uVar15;
        if (uVar15 == 7) goto LAB_01db38ec;
        prVar16 = prVar17 + 1;
        prVar1 = prVar17 + 1;
        uVar8 = uVar15 + 1;
        prVar17 = prVar16;
      } while ((void *)prVar1->leafkey != pvVar13);
      bVar18 = 6 < uVar15;
    }
    prVar4 = prVar16->leaf;
    prVar16->leafkey = ctx->l2_cache[uVar15].leafkey;
    prVar16->leaf = ctx->l2_cache[uVar15].leaf;
    ctx->l2_cache[uVar15].leafkey = (uintptr_t)pvVar11;
    ctx->l2_cache[uVar15].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar13;
    prVar14[1].le_bits.repr = prVar4;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01db38ec:
    if (bVar18) {
      prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                          (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  puVar7 = (ulong *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  if (puVar7 == (ulong *)0x0) {
    *bin_nregs = 0;
    *bin_nfree = 0;
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = puVar7[2] & 0xfffffffffffff000;
    if (((uint)*puVar7 >> 0xc & 1) != 0) {
      *nfree = (ulong)((uint)(*puVar7 >> 0x1c) & 0x3ff);
      uVar12 = (uint)*puVar7 >> 0x14 & 0xff;
      *nregs = (ulong)duckdb_je_bin_infos[uVar12].nregs;
      uVar5 = (uint)(*puVar7 >> 0x26) & 0x3f;
      uVar8 = (ulong)(uVar5 << 8);
      if (uVar12 < duckdb_je_bin_info_nbatched_sizes) {
        uVar8 = (ulong)uVar5 * 0x288;
      }
      mutex = (malloc_mutex_t *)
              ((long)duckdb_je_arenas[(uint)*puVar7 & 0xfff].repr +
              uVar8 + duckdb_je_arena_bin_offsets[uVar12]);
      __mutex = (pthread_mutex_t *)
                ((long)duckdb_je_arenas[(uint)*puVar7 & 0xfff].repr +
                uVar8 + duckdb_je_arena_bin_offsets[uVar12] + 0x48);
      iVar6 = pthread_mutex_trylock(__mutex);
      if (iVar6 != 0) {
        duckdb_je_malloc_mutex_lock_slow(mutex);
        (mutex->field_0).field_0.locked.repr = true;
      }
      puVar2 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
      *puVar2 = *puVar2 + 1;
      if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
        (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
        ppwVar3 = &(mutex->field_0).witness.link.qre_prev;
        *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
      }
      sVar9 = *(long *)((long)&mutex[1].field_0 + 0x40) * *nregs;
      *bin_nregs = sVar9;
      *bin_nfree = sVar9 - (long)mutex[1].field_0.witness.opaque;
      peVar10 = (edata_t *)mutex[2].field_0.witness.name;
      if (peVar10 == (edata_t *)0x0) {
        peVar10 = duckdb_je_edata_heap_first
                            ((edata_heap_t *)&mutex[2].field_0.field_0.prof_data.max_wait_time);
      }
      if (peVar10 == (edata_t *)0x0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = peVar10->e_addr;
      }
      *slabcur_addr = pvVar11;
      (mutex->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      return;
    }
    *bin_nregs = 0;
    *bin_nfree = 0;
    *nfree = 0;
    *nregs = 1;
  }
  *slabcur_addr = (void *)0x0;
  return;
}

Assistant:

void
inspect_extent_util_stats_verbose_get(tsdn_t *tsdn, const void *ptr,
    size_t *nfree, size_t *nregs, size_t *size, size_t *bin_nfree,
    size_t *bin_nregs, void **slabcur_addr) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL
	    && bin_nfree != NULL && bin_nregs != NULL && slabcur_addr != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = *bin_nfree = *bin_nregs = 0;
		*slabcur_addr = NULL;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = *bin_nfree = *bin_nregs = 0;
		*nregs = 1;
		*slabcur_addr = NULL;
		return;
	}

	*nfree = edata_nfree_get(edata);
	const szind_t szind = edata_szind_get(edata);
	*nregs = bin_infos[szind].nregs;
	assert(*nfree <= *nregs);
	assert(*nfree * edata_usize_get(edata) <= *size);

	arena_t *arena = (arena_t *)atomic_load_p(
	    &arenas[edata_arena_ind_get(edata)], ATOMIC_RELAXED);
	assert(arena != NULL);
	const unsigned binshard = edata_binshard_get(edata);
	bin_t *bin = arena_get_bin(arena, szind, binshard);

	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		*bin_nregs = *nregs * bin->stats.curslabs;
		assert(*bin_nregs >= bin->stats.curregs);
		*bin_nfree = *bin_nregs - bin->stats.curregs;
	} else {
		*bin_nfree = *bin_nregs = 0;
	}
	edata_t *slab;
	if (bin->slabcur != NULL) {
		slab = bin->slabcur;
	} else {
		slab = edata_heap_first(&bin->slabs_nonfull);
	}
	*slabcur_addr = slab != NULL ? edata_addr_get(slab) : NULL;
	malloc_mutex_unlock(tsdn, &bin->lock);
}